

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O0

bool __thiscall llvm::FoldingSetBase::RemoveNode(FoldingSetBase *this,Node *N)

{
  void *N_00;
  Node *this_00;
  void **ppvVar1;
  void **Bucket;
  Node *NodeInBucket;
  void *NodeNextPtr;
  void *Ptr;
  Node *N_local;
  FoldingSetBase *this_local;
  
  N_00 = Node::getNextInBucket(N);
  if (N_00 == (void *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this->NumNodes = this->NumNodes - 1;
    Node::SetNextInBucket(N,(void *)0x0);
    NodeNextPtr = N_00;
    do {
      while (this_00 = GetNextPtr(NodeNextPtr), this_00 != (Node *)0x0) {
        NodeNextPtr = Node::getNextInBucket(this_00);
        if ((Node *)NodeNextPtr == N) {
          Node::SetNextInBucket(this_00,N_00);
          return true;
        }
      }
      ppvVar1 = GetBucketPtr(NodeNextPtr);
      NodeNextPtr = *ppvVar1;
    } while ((Node *)NodeNextPtr != N);
    *ppvVar1 = N_00;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FoldingSetBase::RemoveNode(Node *N) {
  // Because each bucket is a circular list, we don't need to compute N's hash
  // to remove it.
  void *Ptr = N->getNextInBucket();
  if (!Ptr) return false;  // Not in folding set.

  --NumNodes;
  N->SetNextInBucket(nullptr);

  // Remember what N originally pointed to, either a bucket or another node.
  void *NodeNextPtr = Ptr;

  // Chase around the list until we find the node (or bucket) which points to N.
  while (true) {
    if (Node *NodeInBucket = GetNextPtr(Ptr)) {
      // Advance pointer.
      Ptr = NodeInBucket->getNextInBucket();

      // We found a node that points to N, change it to point to N's next node,
      // removing N from the list.
      if (Ptr == N) {
        NodeInBucket->SetNextInBucket(NodeNextPtr);
        return true;
      }
    } else {
      void **Bucket = GetBucketPtr(Ptr);
      Ptr = *Bucket;

      // If we found that the bucket points to N, update the bucket to point to
      // whatever is next.
      if (Ptr == N) {
        *Bucket = NodeNextPtr;
        return true;
      }
    }
  }
}